

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O1

u32 u32Deshuffle(u32 w)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ((w >> 1 ^ w) & 0x22222222) * 3 ^ w;
  uVar1 = ((uVar1 >> 2 ^ uVar1) & 0xc0c0c0c) * 5 ^ uVar1;
  uVar2 = (uVar1 >> 4 ^ uVar1) & 0xf000f0;
  uVar1 = (uVar2 << 4 | uVar2) ^ uVar1;
  uVar2 = (uVar1 >> 8 ^ uVar1) & 0xff00;
  return (uVar2 << 8 | uVar2) ^ uVar1;
}

Assistant:

u32 u32Deshuffle(register u32 w)
{
	register u32 t;
	t = (w ^ (w >> 1)) & 0x22222222, w ^= t ^ (t << 1);
	t = (w ^ (w >> 2)) & 0x0C0C0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 4)) & 0x00F000F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 8)) & 0x0000FF00, w ^= t ^ (t << 8);
	t = 0;
	return w;
}